

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

size_t zng_gzfwrite(void *buf,size_t size,size_t nitems,gzFile file)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  
  if (((file != (gzFile)0x0 && size != 0) && (file[1].have == 0x79b1)) &&
     (*(int *)((long)&file[4].pos + 4) == 0)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = nitems;
    sVar3 = SUB168(auVar1 * auVar2,0);
    if (SUB168(auVar1 * auVar2,8) == 0) {
      if (sVar3 != 0) {
        sVar3 = gz_write((gz_state *)file,buf,sVar3);
        return sVar3 / size;
      }
    }
    else {
      gz_error((gz_state *)file,-2,"request does not fit in a size_t");
    }
  }
  return 0;
}

Assistant:

size_t Z_EXPORT PREFIX(gzfwrite)(void const *buf, size_t size, size_t nitems, gzFile file) {
    size_t len;
    gz_state *state;

    /* Exit early if size is zero, also prevents potential division by zero */
    if (size == 0)
        return 0;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_state *)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return 0;

    /* compute bytes to read -- error on overflow */
    len = nitems * size;
    if (len / size != nitems) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in a size_t");
        return 0;
    }

    /* write len bytes to buf, return the number of full items written */
    return len ? gz_write(state, buf, len) / size : 0;
}